

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O1

void __thiscall cppurses::Painter::put(Painter *this,Glyph *tile,size_t x,size_t y)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  if ((x < (this->inner_area_).width) && (y < (this->inner_area_).height)) {
    sVar1 = (this->widget_->top_left_position_).x;
    sVar3 = detail::Border_offset::west(this->widget_);
    sVar2 = (this->widget_->top_left_position_).y;
    sVar4 = detail::Border_offset::north(this->widget_);
    put_global(this,tile,x + sVar1 + sVar3,y + sVar2 + sVar4);
    return;
  }
  return;
}

Assistant:

void Painter::put(const Glyph& tile, std::size_t x, std::size_t y)
{
    if (x >= inner_area_.width || y >= inner_area_.height)
        return;
    const auto x_global = widget_.inner_x() + x;
    const auto y_global = widget_.inner_y() + y;
    this->put_global(tile, x_global, y_global);
}